

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int stopcheck(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol,
             double stol,int retval)

{
  double *array;
  double dVar1;
  double *scheck;
  double stop0;
  double den;
  double num;
  int local_60;
  int i;
  int rcode;
  int retval_local;
  double stol_local;
  double gtol_local;
  double fsval_local;
  double *dx_local;
  double *jac_local;
  double *xf_local;
  double *xc_local;
  int N_local;
  double fx_local;
  
  local_60 = 0;
  if (retval == 1) {
    fx_local._4_4_ = 3;
  }
  else if (retval == 5) {
    fx_local._4_4_ = 5;
  }
  else if (retval == 0xf) {
    fx_local._4_4_ = 0xf;
  }
  else {
    array = (double *)malloc((long)N << 3);
    if (ABS(fx) <= ABS(fsval)) {
      stop0 = ABS(fsval);
    }
    else {
      stop0 = ABS(fx);
    }
    for (num._4_4_ = 0; num._4_4_ < N; num._4_4_ = num._4_4_ + 1) {
      if (ABS(xf[num._4_4_]) <= 1.0 / ABS(dx[num._4_4_])) {
        den = 1.0 / ABS(dx[num._4_4_]);
      }
      else {
        den = ABS(xf[num._4_4_]);
      }
      array[num._4_4_] = (ABS(jac[num._4_4_]) * den) / stop0;
    }
    dVar1 = array_max_abs(array,N);
    if (gtol < dVar1) {
      for (num._4_4_ = 0; num._4_4_ < N; num._4_4_ = num._4_4_ + 1) {
        if (ABS(xf[num._4_4_]) <= 1.0 / ABS(dx[num._4_4_])) {
          stop0 = 1.0 / ABS(dx[num._4_4_]);
        }
        else {
          stop0 = ABS(xf[num._4_4_]);
        }
        array[num._4_4_] = ABS(xf[num._4_4_] - xc[num._4_4_]) / stop0;
      }
      dVar1 = array_max_abs(array,N);
      if (dVar1 <= stol) {
        local_60 = 2;
      }
    }
    else {
      local_60 = 1;
    }
    free(array);
    fx_local._4_4_ = local_60;
  }
  return fx_local._4_4_;
}

Assistant:

int stopcheck(double fx,int N,double *xc,double *xf,double *jac,double *dx,double fsval,double gtol,double stol,int retval) {
	int rcode,i;
	double num,den;
	double stop0;
	double *scheck;
	
	rcode = 0;	
	if (retval == 1) {
		rcode = 3;
		return rcode;
	}
	if (retval == 5) {
		rcode = 5;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}
	scheck = (double*) malloc(sizeof(double) *N);
	
	if (fabs(fx) > fabs(fsval)) {
			den = fabs(fx);
	} else {
			den = fabs(fsval);
	}
	for(i = 0; i < N;++i) {
		if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
			num = fabs(xf[i]);
		} else {
			num = 1.0 / fabs(dx[i]);
		}
		scheck[i] = fabs(jac[i]) * num / den;
	}
	
	stop0 = array_max_abs(scheck,N);

	if (stop0 <= gtol) {
		rcode = 1;
	} else {
		for(i = 0; i < N;++i) {
			if (fabs(xf[i]) > 1.0 / fabs(dx[i])) {
				den = fabs(xf[i]);
			} else {
				den = 1.0 / fabs(dx[i]);
			}
			num = fabs(xf[i] - xc[i]);
			scheck[i] = num / den;
		}
		stop0 = array_max_abs(scheck,N);
		if (stop0 <= stol) {
			rcode = 2;
		}
	}
	
	free(scheck);
	return rcode;
}